

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::basic_inode_48(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *this,db_type *db_instance,inode16_type *source_node,db_leaf_unique_ptr *child,
                tree_depth_type depth)

{
  undefined1 auVar1 [32];
  undefined1 in_ZMM0 [64];
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  local_20;
  
  *(key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
    *)this = (source_node->
             super_inode_16_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>).
             super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             .
             super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             .k_prefix;
  this->field_0x8 = 0x11;
  auVar1 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  (this->child_indexes)._M_elems[0].value = auVar1;
  (this->child_indexes)._M_elems[0x20].value = auVar1;
  (this->child_indexes)._M_elems[0x40].value = auVar1;
  (this->child_indexes)._M_elems[0x60].value = auVar1;
  (this->child_indexes)._M_elems[0x80].value = auVar1;
  (this->child_indexes)._M_elems[0xa0].value = auVar1;
  (this->child_indexes)._M_elems[0xc0].value = auVar1;
  (this->child_indexes)._M_elems[0xe0].value = auVar1;
  local_20._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  ._M_head_impl.db =
       *(_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
         *)&(child->_M_t).
            super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            .
            super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            .
            super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
            ._M_head_impl;
  local_20._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
  ._M_head_impl =
       (child->_M_t).
       super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
       .
       super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
       ._M_head_impl;
  (child->_M_t).
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
  ._M_head_impl =
       (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *
       )0x0;
  init(this,(EVP_PKEY_CTX *)db_instance);
  std::
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

constexpr basic_inode_48(db_type &db_instance,
                           inode16_type &__restrict source_node,
                           db_leaf_unique_ptr &&child,
                           tree_depth_type depth) noexcept
      : parent_class{source_node} {
    init(db_instance, source_node, std::move(child), depth);
  }